

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_0::MemoryAllocator::allocateContext(MemoryAllocator *this)

{
  Random *rnd;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> first;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> last;
  deUint32 dVar1;
  int iVar2;
  GLenum GVar3;
  Library *pLVar4;
  undefined4 extraout_var;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  EGLContext context;
  EGLint attribList [3];
  value_type local_38;
  undefined8 local_30;
  undefined4 local_28;
  
  std::vector<void_*,_std::allocator<void_*>_>::reserve
            (&this->m_contexts,
             ((long)(this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_contexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pLVar4 = EglTestContext::getLibrary(this->m_eglTestCtx);
  local_30 = 0x200003098;
  local_28 = 0x3038;
  (**pLVar4->_vptr_Library)(pLVar4,0x30a0);
  dVar1 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
  eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                   ,0x110);
  iVar2 = (*pLVar4->_vptr_Library[6])(pLVar4,this->m_display,this->m_config,0,&local_30);
  local_38 = (value_type)CONCAT44(extraout_var,iVar2);
  dVar1 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
  eglu::checkError(dVar1,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                   ,0x112);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_contexts,&local_38);
  if (this->m_use == true) {
    first._M_current =
         (this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    last._M_current =
         (this->m_pbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (last._M_current != first._M_current) {
      rnd = &this->m_rnd;
      pvVar5 = de::Random::
               choose<void*,__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
                         (rnd,first,last);
      fVar6 = deRandom_getFloat(&rnd->m_rnd);
      fVar7 = deRandom_getFloat(&rnd->m_rnd);
      fVar8 = deRandom_getFloat(&rnd->m_rnd);
      fVar9 = deRandom_getFloat(&rnd->m_rnd);
      (*pLVar4->_vptr_Library[0x27])(pLVar4,this->m_display,pvVar5,pvVar5,local_38);
      dVar1 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
      eglu::checkError(dVar1,"makeCurrent(m_display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0x120);
      (*(this->m_gl).clearColor)(fVar6,fVar7,fVar8,fVar9);
      GVar3 = (*(this->m_gl).getError)();
      glu::checkError(GVar3,"glClearColor()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                      ,0x123);
      (*(this->m_gl).clear)(0x4000);
      GVar3 = (*(this->m_gl).getError)();
      glu::checkError(GVar3,"glClear()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                      ,0x126);
      (*pLVar4->_vptr_Library[0x27])(pLVar4,this->m_display,0,0,0);
      dVar1 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
      eglu::checkError(dVar1,
                       "makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMemoryStressTests.cpp"
                       ,0x128);
    }
  }
  return;
}

Assistant:

void MemoryAllocator::allocateContext (void)
{
	// Reserve space for new allocations
	try
	{
		m_contexts.reserve(m_contexts.size() + 1);
	}
	catch (const std::bad_alloc&)
	{
		m_errorString	= "std::bad_alloc when allocating more space for testcase. Out of host memory.";
		m_failed		= true;
		return;
	}

	// Allocate context
	try
	{
		const Library&	egl				= m_eglTestCtx.getLibrary();
		const EGLint	attribList[]	=
		{
			EGL_CONTEXT_CLIENT_VERSION, 2,
			EGL_NONE
		};

		EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));
		EGLContext context = egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attribList);
		EGLU_CHECK_MSG(egl, "eglCreateContext");

		DE_ASSERT(context != EGL_NO_CONTEXT);

		m_contexts.push_back(context);

		if (m_use && m_pbuffers.size() > 0)
		{
			EGLSurface				surface		= m_rnd.choose<EGLSurface>(m_pbuffers.begin(), m_pbuffers.end());
			const float				red			= m_rnd.getFloat();
			const float				green		= m_rnd.getFloat();
			const float				blue		= m_rnd.getFloat();
			const float				alpha		= m_rnd.getFloat();

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, context));

			m_gl.clearColor(red, green, blue, alpha);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClearColor()");

			m_gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glClear()");

			EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		}
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_ALLOC)
		{
			m_errorString	= "eglCreateContext returned EGL_BAD_ALLOC";
			m_failed		= true;
			return;
		}
		else
			throw;
	}
}